

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psset.c
# Opt level: O2

void psset_stats_insert(psset_t *psset,hpdata_t *ps)

{
  pszind_t pVar1;
  psset_bin_stats_t *binstats;
  
  if (ps->h_nactive == 0x200) {
    binstats = (psset->stats).full_slabs;
  }
  else if (ps->h_nactive == 0) {
    binstats = (psset->stats).empty_slabs;
  }
  else {
    pVar1 = psset_hpdata_heap_index(ps);
    binstats = (psset->stats).nonfull_slabs[pVar1];
  }
  psset_bin_stats_insert(psset,binstats,ps);
  return;
}

Assistant:

static void
psset_stats_insert(psset_t* psset, hpdata_t *ps) {
	if (hpdata_empty(ps)) {
		psset_bin_stats_insert(psset, psset->stats.empty_slabs, ps);
	} else if (hpdata_full(ps)) {
		psset_bin_stats_insert(psset, psset->stats.full_slabs, ps);
	} else {
		pszind_t pind = psset_hpdata_heap_index(ps);
		psset_bin_stats_insert(psset, psset->stats.nonfull_slabs[pind],
		    ps);
	}
}